

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void var_filter_block2d_bil_second_pass_c
               (uint16_t *a,uint8_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  for (uVar1 = 0; uVar1 != output_height; uVar1 = uVar1 + 1) {
    lVar2 = (ulong)(src_pixels_per_line - output_width) * -2;
    for (uVar3 = 0; output_width != uVar3; uVar3 = uVar3 + 1) {
      b[uVar3] = (uint8_t)((uint)*filter * (uint)a[uVar3] +
                           (uint)filter[1] * (uint)a[pixel_step + uVar3] + 0x40 >> 7);
      lVar2 = lVar2 + -2;
    }
    b = b + output_width;
    a = (uint16_t *)((long)a - lVar2);
  }
  return;
}

Assistant:

static void var_filter_block2d_bil_second_pass_c(
    const uint16_t *a, uint8_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      b[j] = ROUND_POWER_OF_TWO(
          (int)a[0] * filter[0] + (int)a[pixel_step] * filter[1], FILTER_BITS);
      ++a;
    }

    a += src_pixels_per_line - output_width;
    b += output_width;
  }
}